

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O3

bool template_image::NullAssignment(void)

{
  uint8_t fakeArray [1];
  ImageTemplate<unsigned_char> image;
  uchar local_39;
  ImageTemplate<unsigned_char> local_38;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_38,0,0,'\x01','\x01');
  rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::assign(&local_38,&local_39,0,0,'\0','\0');
  local_38._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_38);
  return false;
}

Assistant:

bool NullAssignment()
    {
        try {
            PenguinV_Image::ImageTemplate < uint8_t > image;

            uint8_t fakeArray[1];
            uint8_t fakeValue = Unit_Test::randomValue<uint8_t>( 2 );
            if( fakeValue == 1 )
                fakeValue = 0;

            image.assign( fakeArray, fakeValue, fakeValue, fakeValue, fakeValue );
        }
        catch( imageException & ) {
            return true;
        }

        return false;
    }